

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void TIFFRGBAImageEnd(TIFFRGBAImage *img)

{
  TIFFRGBAImage *img_local;
  
  if (img->Map != (TIFFRGBValue *)0x0) {
    _TIFFfreeExt(img->tif,img->Map);
    img->Map = (TIFFRGBValue *)0x0;
  }
  if (img->BWmap != (uint32_t **)0x0) {
    _TIFFfreeExt(img->tif,img->BWmap);
    img->BWmap = (uint32_t **)0x0;
  }
  if (img->PALmap != (uint32_t **)0x0) {
    _TIFFfreeExt(img->tif,img->PALmap);
    img->PALmap = (uint32_t **)0x0;
  }
  if (img->ycbcr != (TIFFYCbCrToRGB *)0x0) {
    _TIFFfreeExt(img->tif,img->ycbcr);
    img->ycbcr = (TIFFYCbCrToRGB *)0x0;
  }
  if (img->cielab != (TIFFCIELabToRGB *)0x0) {
    _TIFFfreeExt(img->tif,img->cielab);
    img->cielab = (TIFFCIELabToRGB *)0x0;
  }
  if (img->UaToAa != (uint8_t *)0x0) {
    _TIFFfreeExt(img->tif,img->UaToAa);
    img->UaToAa = (uint8_t *)0x0;
  }
  if (img->Bitdepth16To8 != (uint8_t *)0x0) {
    _TIFFfreeExt(img->tif,img->Bitdepth16To8);
    img->Bitdepth16To8 = (uint8_t *)0x0;
  }
  if (img->redcmap != (uint16_t *)0x0) {
    _TIFFfreeExt(img->tif,img->redcmap);
    _TIFFfreeExt(img->tif,img->greencmap);
    _TIFFfreeExt(img->tif,img->bluecmap);
    img->bluecmap = (uint16_t *)0x0;
    img->greencmap = (uint16_t *)0x0;
    img->redcmap = (uint16_t *)0x0;
  }
  return;
}

Assistant:

void TIFFRGBAImageEnd(TIFFRGBAImage *img)
{
    if (img->Map)
    {
        _TIFFfreeExt(img->tif, img->Map);
        img->Map = NULL;
    }
    if (img->BWmap)
    {
        _TIFFfreeExt(img->tif, img->BWmap);
        img->BWmap = NULL;
    }
    if (img->PALmap)
    {
        _TIFFfreeExt(img->tif, img->PALmap);
        img->PALmap = NULL;
    }
    if (img->ycbcr)
    {
        _TIFFfreeExt(img->tif, img->ycbcr);
        img->ycbcr = NULL;
    }
    if (img->cielab)
    {
        _TIFFfreeExt(img->tif, img->cielab);
        img->cielab = NULL;
    }
    if (img->UaToAa)
    {
        _TIFFfreeExt(img->tif, img->UaToAa);
        img->UaToAa = NULL;
    }
    if (img->Bitdepth16To8)
    {
        _TIFFfreeExt(img->tif, img->Bitdepth16To8);
        img->Bitdepth16To8 = NULL;
    }

    if (img->redcmap)
    {
        _TIFFfreeExt(img->tif, img->redcmap);
        _TIFFfreeExt(img->tif, img->greencmap);
        _TIFFfreeExt(img->tif, img->bluecmap);
        img->redcmap = img->greencmap = img->bluecmap = NULL;
    }
}